

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

string * __thiscall
pbrt::Array2D<double>::ToString_abi_cxx11_(string *__return_storage_ptr__,Array2D<double> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double value;
  string local_58;
  double local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::Bounds2<int>const&>
            (__return_storage_ptr__,"[ Array2D extent: %s values: [",&this->extent);
  iVar3 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
  if (iVar3 < (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y) {
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      for (iVar4 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
          iVar1 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x, iVar4 < iVar1;
          iVar4 = iVar4 + 1) {
        iVar2 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
        local_38 = this->values
                   [((iVar3 - (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y) *
                     (iVar1 - iVar2) - iVar2) + iVar4];
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        detail::stringPrintfRecursive<double&>(&local_58,"%s, ",&local_38);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      iVar3 = iVar3 + 1;
    } while (iVar3 < (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        std::string s = StringPrintf("[ Array2D extent: %s values: [", extent);
        for (int y = extent.pMin.y; y < extent.pMax.y; ++y) {
            s += " [ ";
            for (int x = extent.pMin.x; x < extent.pMax.x; ++x) {
                T value = (*this)(x, y);
                s += StringPrintf("%s, ", value);
            }
            s += "], ";
        }
        s += " ] ]";
        return s;
    }